

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

void * Curl_ssl_scache_get_obj(Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key)

{
  CURLcode CVar1;
  char *pcVar2;
  Curl_cfilter *local_58;
  void *sobj;
  Curl_ssl_scache_peer *pCStack_40;
  CURLcode result;
  Curl_ssl_scache_peer *peer;
  ssl_primary_config *conn_config;
  Curl_ssl_scache *scache;
  char *ssl_peer_key_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  scache = (Curl_ssl_scache *)ssl_peer_key;
  ssl_peer_key_local = (char *)data;
  data_local = (Curl_easy *)cf;
  conn_config = (ssl_primary_config *)cf_ssl_scache_get(data);
  peer = (Curl_ssl_scache_peer *)Curl_ssl_cf_get_primary_config((Curl_cfilter *)data_local);
  pCStack_40 = (Curl_ssl_scache_peer *)0x0;
  if (conn_config == (ssl_primary_config *)0x0) {
    cf_local = (Curl_cfilter *)0x0;
  }
  else {
    CVar1 = cf_ssl_find_peer_by_key
                      ((Curl_easy *)ssl_peer_key_local,(Curl_ssl_scache *)conn_config,(char *)scache
                       ,(ssl_primary_config *)peer,&stack0xffffffffffffffc0);
    if (CVar1 == CURLE_OK) {
      if (pCStack_40 == (Curl_ssl_scache_peer *)0x0) {
        local_58 = (Curl_cfilter *)0x0;
      }
      else {
        local_58 = (Curl_cfilter *)pCStack_40->sobj;
      }
      if ((((ssl_peer_key_local != (char *)0x0) &&
           ((*(ulong *)(ssl_peer_key_local + 0xa2c) >> 0x1e & 1) != 0)) &&
          ((*(long *)(ssl_peer_key_local + 0x1310) == 0 ||
           (0 < *(int *)(*(long *)(ssl_peer_key_local + 0x1310) + 8))))) &&
         (0 < Curl_trc_feat_ssls.log_level)) {
        pcVar2 = "No";
        if (local_58 != (Curl_cfilter *)0x0) {
          pcVar2 = "Found";
        }
        Curl_trc_ssls((Curl_easy *)ssl_peer_key_local,"%s cached session for \'%s\'",pcVar2,scache);
      }
      cf_local = local_58;
    }
    else {
      cf_local = (Curl_cfilter *)0x0;
    }
  }
  return cf_local;
}

Assistant:

void *Curl_ssl_scache_get_obj(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              const char *ssl_peer_key)
{
  struct Curl_ssl_scache *scache = cf_ssl_scache_get(data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct Curl_ssl_scache_peer *peer = NULL;
  CURLcode result;
  void *sobj;

  if(!scache)
    return NULL;

  result = cf_ssl_find_peer_by_key(data, scache, ssl_peer_key, conn_config,
                                   &peer);
  if(result)
    return NULL;

  sobj = peer ? peer->sobj : NULL;

  CURL_TRC_SSLS(data, "%s cached session for '%s'",
                sobj ? "Found" : "No", ssl_peer_key);
  return sobj;
}